

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<QGridLayoutBox> * __thiscall
QList<QGridLayoutBox>::fill(QList<QGridLayoutBox> *this,parameter_type t,qsizetype newSize)

{
  qreal *pqVar1;
  Data *pDVar2;
  qreal qVar3;
  QGridLayoutBox *pQVar4;
  qreal qVar5;
  qreal qVar6;
  undefined1 auVar7 [16];
  qsizetype capacity;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QGridLayoutBox>_*,_QGridLayoutBox_*> local_58;
  qreal local_48;
  qreal qStack_40;
  qreal local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar2 = (this->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar2->super_QArrayData).alloc < newSize)) {
    capacity = QArrayDataPointer<QGridLayoutBox>::detachCapacity(&this->d,newSize);
    local_58 = QTypedArrayData<QGridLayoutBox>::allocate(capacity,KeepSize);
    local_48 = 0.0;
    QtPrivate::QGenericArrayOps<QGridLayoutBox>::copyAppend
              ((QGenericArrayOps<QGridLayoutBox> *)&local_58,newSize,t);
    auVar7._0_8_ = (this->d).d;
    auVar7._8_8_ = (this->d).ptr;
    (this->d).d = local_58.first;
    (this->d).ptr = local_58.second;
    qVar3 = (qreal)(this->d).size;
    (this->d).size = (qsizetype)local_48;
    local_58 = (pair<QTypedArrayData<QGridLayoutBox>_*,_QGridLayoutBox_*>)auVar7;
    local_48 = qVar3;
    QArrayDataPointer<QGridLayoutBox>::~QArrayDataPointer
              ((QArrayDataPointer<QGridLayoutBox> *)&local_58);
  }
  else {
    local_38 = t->q_minimumAscent;
    local_58.first = (QTypedArrayData<QGridLayoutBox> *)t->q_minimumSize;
    local_58.second = (QGridLayoutBox *)t->q_preferredSize;
    local_48 = t->q_maximumSize;
    qStack_40 = t->q_minimumDescent;
    pQVar4 = (this->d).ptr;
    lVar8 = (this->d).size;
    if (newSize <= lVar8) {
      lVar8 = newSize;
    }
    for (lVar9 = 0; lVar8 * 0x28 - lVar9 != 0; lVar9 = lVar9 + 0x28) {
      pqVar1 = (qreal *)((long)&pQVar4->q_minimumSize + lVar9);
      pqVar1[4] = t->q_minimumAscent;
      qVar3 = t->q_minimumSize;
      qVar5 = t->q_preferredSize;
      qVar6 = t->q_minimumDescent;
      pqVar1[2] = t->q_maximumSize;
      pqVar1[3] = qVar6;
      *pqVar1 = qVar3;
      pqVar1[1] = qVar5;
    }
    lVar8 = (this->d).size;
    if (newSize - lVar8 == 0 || newSize < lVar8) {
      if (newSize < lVar8) {
        (this->d).size = newSize;
      }
    }
    else {
      QtPrivate::QGenericArrayOps<QGridLayoutBox>::copyAppend
                ((QGenericArrayOps<QGridLayoutBox> *)this,newSize - lVar8,(parameter_type)&local_58)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}